

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::MockCodeGenerator::Generate
          (MockCodeGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  string_view data;
  string_view data_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  uVar2;
  bool bVar3;
  bool bVar4;
  Edition EVar5;
  int iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  Descriptor *pDVar10;
  ostream *this_00;
  SourceCodeInfo *this_01;
  FieldDescriptor *this_02;
  string *v;
  LogMessage *pLVar11;
  size_type sVar12;
  uint32_t *puVar13;
  Arena *pAVar14;
  reference pvVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pZVar16;
  undefined4 extraout_var_02;
  Nonnull<std::string_*> pbVar17;
  AlphaNum *pAVar18;
  char *__str;
  FileDescriptor *pFVar19;
  string_view sVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  FixedMapping replacements;
  FixedMapping replacements_00;
  string_view generator_name;
  string_view generator_name_00;
  string_view generator_name_01;
  string_view generator_name_02;
  string_view generator_name_03;
  string_view generator_name_04;
  string_view parameter_00;
  string_view parameter_01;
  string_view parameter_02;
  GeneratorContext *in_stack_ffffffffffffef20;
  AnnotationCollector *local_10a8;
  bool local_ef2;
  AlphaNum local_ec0;
  undefined1 local_e90 [16];
  string local_e80;
  AlphaNum local_e60;
  string local_e30;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_e10;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  meta_output;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_e00;
  AlphaNum local_df8;
  AlphaNum local_dc8;
  string local_d98;
  string_view local_d78;
  string_view local_d68;
  string_view local_d58;
  undefined8 local_d48;
  undefined8 uStack_d40;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_d30;
  AlphaNum local_d28;
  AlphaNum local_cf8;
  string local_cc8;
  string_view local_ca8;
  string_view local_c98;
  string_view local_c88;
  undefined8 local_c78;
  undefined8 uStack_c70;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_c58;
  AlphaNum local_c50;
  AlphaNum local_c20;
  string local_bf0;
  string_view local_bd0;
  string_view local_bc0;
  string_view local_bb0;
  allocator<char> local_b99;
  undefined1 local_b98 [8];
  string annotate_suffix;
  string local_b58;
  string_view local_b38;
  undefined1 local_b28 [8];
  Printer printer_2;
  undefined1 local_9f0 [8];
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  string local_9a0;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_980;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_2;
  undefined1 local_968 [8];
  Printer printer_1;
  string local_830 [32];
  undefined1 local_810 [16];
  string local_800;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_7e0;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_1;
  GeneratedCodeInfo_Annotation *annotation_1;
  lts_20250127 *local_7b0;
  undefined8 local_7a8;
  basic_string_view<char,_std::char_traits<char>_> local_7a0;
  undefined1 local_790 [16];
  undefined1 local_780 [8];
  string content_1;
  GeneratedCodeInfo info_1;
  undefined1 local_718 [8];
  Printer printer;
  string local_5e0 [32];
  undefined1 local_5c0 [16];
  string local_5b0;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_590;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  GeneratedCodeInfo_Annotation *annotation;
  lts_20250127 *local_560;
  undefined8 local_558;
  basic_string_view<char,_std::char_traits<char>_> local_550;
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  string content;
  GeneratedCodeInfo info;
  size_t i_1;
  string_view local_4d0;
  string_view local_4c0;
  string_view local_4b0;
  ConvertibleToStringView local_4a0;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_490;
  undefined1 local_478 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insert_into;
  string_view local_440;
  string_view local_430;
  byte local_419;
  size_t sStack_418;
  bool insert_endlines;
  size_t sStack_410;
  LogMessage local_408;
  Voidify local_3f1;
  LogMessage local_3f0;
  Voidify local_3d9;
  undefined1 local_3d8 [8];
  Version compiler_version;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_388;
  size_t local_378;
  char *local_370;
  LogMessage local_368;
  Voidify local_351;
  undefined1 local_350 [8];
  FieldDescriptorProto field_descriptor_proto;
  LogMessage local_2d0;
  Voidify local_2ba;
  bool local_2b9;
  undefined1 local_2b8 [7];
  bool has_source_code_info;
  FileDescriptorProto file_descriptor_proto;
  LogMessage local_188;
  Voidify local_171;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_170;
  size_t local_160;
  char *local_158;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_150;
  size_t local_140;
  char *local_138;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_130;
  size_t local_120;
  char *local_118;
  string_view local_110;
  string_view local_100;
  undefined1 auStack_f0 [8];
  string_view command;
  int local_c0;
  int i;
  bool annotate;
  size_t local_a8;
  char *local_a0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_98;
  size_t local_88;
  char *local_80;
  undefined1 local_78 [8];
  string_view test_case;
  string *error_local;
  GeneratorContext *context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  MockCodeGenerator *this_local;
  
  test_case._M_str = (char *)error;
  _local_78 = compiler::anon_unknown_0::GetTestCase();
  local_88 = (size_t)local_78;
  local_80 = (char *)test_case._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"high_minimum")
  ;
  bVar1._M_str = local_80;
  bVar1._M_len = local_88;
  bVar3 = std::operator==(bVar1,local_98);
  if (bVar3) {
    this->minimum_edition_ = EDITION_99997_TEST_ONLY;
  }
  else {
    local_a8 = (size_t)local_78;
    local_a0 = (char *)test_case._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&i,"low_maximum");
    __x_03._M_str = local_a0;
    __x_03._M_len = local_a8;
    bVar3 = std::operator==(__x_03,_i);
    if (bVar3) {
      this->maximum_edition_ = EDITION_PROTO2;
    }
  }
  EVar5 = CodeGenerator::GetEdition(file);
  if ((999 < (int)EVar5) && ((this->suppressed_features_ & 2) == 0)) {
    protobuf::internal::
    VisitDescriptors<google::protobuf::compiler::MockCodeGenerator::Generate(google::protobuf::FileDescriptor_const*,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)const::__0>
              (file);
  }
  bVar3 = false;
  for (local_c0 = 0; iVar6 = FileDescriptor::message_type_count(file), local_c0 < iVar6;
      local_c0 = local_c0 + 1) {
    pDVar10 = FileDescriptor::message_type(file,local_c0);
    sVar20 = Descriptor::name(pDVar10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&command._M_str,
               "MockCodeGenerator_");
    bVar4 = absl::lts_20250127::StartsWith(sVar20,stack0xffffffffffffff20);
    if (bVar4) {
      pDVar10 = FileDescriptor::message_type(file,local_c0);
      local_100 = Descriptor::name(pDVar10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_110,"MockCodeGenerator_");
      _auStack_f0 = absl::lts_20250127::StripPrefix(local_100,local_110);
      local_120 = (size_t)auStack_f0;
      local_118 = (char *)command._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"Error");
      __x_02._M_str = local_118;
      __x_02._M_len = local_120;
      bVar3 = std::operator==(__x_02,local_130);
      if (bVar3) {
        std::__cxx11::string::operator=
                  ((string *)test_case._M_str,"Saw message type MockCodeGenerator_Error.");
        this_local._7_1_ = 0;
        goto LAB_01299f5b;
      }
      local_140 = (size_t)auStack_f0;
      local_138 = (char *)command._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,"Exit");
      __x_01._M_str = local_138;
      __x_01._M_len = local_140;
      bVar3 = std::operator==(__x_01,local_150);
      if (bVar3) {
        this_00 = std::operator<<((ostream *)&std::cerr,"Saw message type MockCodeGenerator_Exit.");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        exit(0x7b);
      }
      local_160 = (size_t)auStack_f0;
      local_158 = (char *)command._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170,"Abort");
      __x_00._M_str = local_158;
      __x_00._M_len = local_160;
      bVar3 = std::operator!=(__x_00,local_170);
      bVar1 = _auStack_f0;
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_188,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0x102,"command != \"Abort\"");
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_188);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar11,(char (*) [42])"Saw message type MockCodeGenerator_Abort.");
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_171,pLVar11);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_188);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 ((long)&file_descriptor_proto.field_0 + 0xe0),"HasSourceCodeInfo");
      bVar3 = std::operator==(bVar1,stack0xfffffffffffffe40);
      bVar1 = _auStack_f0;
      if (bVar3) {
        FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_2b8);
        FileDescriptor::CopySourceCodeInfoTo(file,(FileDescriptorProto *)local_2b8);
        bVar3 = FileDescriptorProto::has_source_code_info((FileDescriptorProto *)local_2b8);
        local_ef2 = false;
        if (bVar3) {
          this_01 = FileDescriptorProto::source_code_info((FileDescriptorProto *)local_2b8);
          iVar6 = SourceCodeInfo::location_size(this_01);
          local_ef2 = 0 < iVar6;
        }
        local_2b9 = local_ef2;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_2d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0x10a);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2d0);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar11,(char (*) [55])
                                     "Saw message type MockCodeGenerator_HasSourceCodeInfo: ");
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar11,(bool)(local_2b9 & 1));
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar11,(char (*) [2])0x2073f9e);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_2ba,pLVar11);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_2d0);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 ((long)&field_descriptor_proto.field_0 + 0x48),"HasJsonName");
      bVar3 = std::operator==(bVar1,stack0xfffffffffffffd10);
      if (bVar3) {
        FieldDescriptorProto::FieldDescriptorProto((FieldDescriptorProto *)local_350);
        pDVar10 = FileDescriptor::message_type(file,local_c0);
        this_02 = Descriptor::field(pDVar10,0);
        FieldDescriptor::CopyTo(this_02,(FieldDescriptorProto *)local_350);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_368,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0x110);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_368);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar11,(char (*) [16])"Saw json_name: ");
        bVar3 = FieldDescriptorProto::has_json_name((FieldDescriptorProto *)local_350);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,bVar3);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_351,pLVar11);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_368);
      }
      local_378 = (size_t)auStack_f0;
      local_370 = (char *)command._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_388,"Annotate");
      __x._M_str = local_370;
      __x._M_len = local_378;
      bVar3 = std::operator==(__x,local_388);
      bVar1 = _auStack_f0;
      if (!bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   ((long)&compiler_version.field_0 + 0x18),"ShowVersionNumber");
        bVar3 = std::operator==(bVar1,stack0xfffffffffffffc58);
        if (!bVar3) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_408,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0x11d);
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_408);
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                              (pLVar11,(char (*) [36])"Unknown MockCodeGenerator command: ");
          sStack_418 = (size_t)auStack_f0;
          sStack_410 = command._M_len;
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,_auStack_f0);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_3f1,pLVar11);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_408);
        }
        Version::Version((Version *)local_3d8);
        (*context->_vptr_GeneratorContext[7])(context,(Version *)local_3d8);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_3f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0x117);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_3f0);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar11,(char (*) [23])"Saw compiler_version: ");
        iVar7 = Version::major((Version *)local_3d8);
        iVar8 = Version::minor((Version *)local_3d8);
        iVar9 = Version::patch((Version *)local_3d8);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar11,iVar7 * 1000000 + iVar8 * 1000 + iVar9);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar11,(char (*) [2])0x1eb00e0);
        v = Version::suffix_abi_cxx11_((Version *)local_3d8);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,v);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_3d9,pLVar11);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_3f0);
      }
      bVar3 = true;
    }
  }
  local_430 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)parameter);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_440,"insert_endlines=");
  local_419 = absl::lts_20250127::StartsWith(local_430,local_440);
  if ((bool)local_419) {
LAB_01298bb7:
    local_4c0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)parameter);
    __str = "insert=";
    if ((local_419 & 1) != 0) {
      __str = "insert_endlines=";
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4d0,__str);
    local_4b0 = absl::lts_20250127::StripPrefix(local_4c0,local_4d0);
    absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
              (&local_4a0,local_4b0);
    absl::lts_20250127::StrSplit<char,absl::lts_20250127::SkipEmpty>
              (&local_490,(lts_20250127 *)local_4a0.value_._M_len,local_4a0.value_._M_str,0x2c);
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_478,&local_490);
    info.field_0._24_8_ = 0;
    while( true ) {
      sVar12 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_478);
      if (sVar12 <= (ulong)info.field_0._24_8_) break;
      GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)((long)&content.field_2 + 8));
      auVar21 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->name_);
      local_540 = auVar21;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_550,"first_insert");
      sVar20._M_str = (char *)local_550._M_len;
      sVar20._M_len = local_540._8_8_;
      parameter_00._M_str = (char *)file;
      parameter_00._M_len = (size_t)local_550._M_str;
      pbVar17 = (Nonnull<std::string_*>)local_550._M_len;
      pFVar19 = (FileDescriptor *)local_550._M_str;
      GetOutputFileContent_abi_cxx11_
                ((string *)local_530,(MockCodeGenerator *)local_540._0_8_,sVar20,parameter_00,
                 (FileDescriptor *)context,in_stack_ffffffffffffef20);
      if ((local_419 & 1) != 0) {
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&annotation,(char (*) [2])0x1df11df,(char (*) [3])0x1df0ea8);
        local_560 = (lts_20250127 *)&annotation;
        local_558 = 1;
        replacements._M_len = (size_type)local_530;
        replacements._M_array = (iterator)0x1;
        absl::lts_20250127::StrReplaceAll(local_560,replacements,pbVar17);
      }
      if (bVar3) {
        output._M_t.
        super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl =
             (__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
              )GeneratedCodeInfo::add_annotation((GeneratedCodeInfo *)((long)&content.field_2 + 8));
        GeneratedCodeInfo_Annotation::set_begin
                  ((GeneratedCodeInfo_Annotation *)
                   output._M_t.
                   super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                   _M_head_impl,0);
        uVar2._M_t.
        super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl =
             output._M_t.
             super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
             _M_head_impl;
        iVar7 = std::__cxx11::string::size();
        GeneratedCodeInfo_Annotation::set_end
                  ((GeneratedCodeInfo_Annotation *)
                   uVar2._M_t.
                   super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                   _M_head_impl,iVar7);
        uVar2 = output;
        puVar13 = protobuf::internal::HasBits<1>::operator[]
                            ((HasBits<1> *)
                             ((long)output._M_t.
                                    super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                                    ._M_head_impl + 0x10),0);
        *(byte *)puVar13 = (byte)*puVar13 | 1;
        pAVar14 = protobuf::MessageLite::GetArena
                            ((MessageLite *)
                             uVar2._M_t.
                             super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                             .
                             super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                             ._M_head_impl);
        protobuf::internal::ArenaStringPtr::Set
                  ((ArenaStringPtr *)
                   ((long)uVar2._M_t.
                          super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                          .
                          super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                          ._M_head_impl + 0x30),"first_path",pAVar14);
      }
      pvVar15 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_478,info.field_0._24_8_);
      auVar21 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar15);
      generator_name._M_len = auVar21._8_8_;
      generator_name._M_str = (char *)file;
      local_5c0 = auVar21;
      GetOutputFileName_abi_cxx11_(&local_5b0,auVar21._0_8_,generator_name,pFVar19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_5e0,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 compiler::(anonymous_namespace)::kFirstInsertionPointName,
                 (allocator<char> *)&printer.field_0x12f);
      iVar6 = (*context->_vptr_GeneratorContext[5])
                        (context,&local_5b0,local_5e0,(undefined1 *)((long)&content.field_2 + 8));
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&local_590,(pointer)CONCAT44(extraout_var,iVar6));
      std::__cxx11::string::~string(local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&printer.field_0x12f);
      std::__cxx11::string::~string((string *)&local_5b0);
      pZVar16 = std::
                unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                ::get(&local_590);
      protobuf::io::Printer::Printer((Printer *)local_718,pZVar16,'$',(AnnotationCollector *)0x0);
      sVar20 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_530);
      protobuf::io::Printer::PrintRaw((Printer *)local_718,sVar20);
      info_1.field_0._28_1_ = protobuf::io::Printer::failed((Printer *)local_718);
      if ((bool)info_1.field_0._28_1_) {
        std::__cxx11::string::operator=
                  ((string *)test_case._M_str,"MockCodeGenerator detected write error.");
        this_local._7_1_ = 0;
      }
      info_1.field_0._29_3_ = 0;
      protobuf::io::Printer::~Printer((Printer *)local_718);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr(&local_590);
      std::__cxx11::string::~string((string *)local_530);
      GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)((long)&content.field_2 + 8));
      if (info_1.field_0._28_4_ != 0) goto LAB_012995db;
      GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)((long)&content_1.field_2 + 8));
      auVar21 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->name_);
      local_790 = auVar21;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_7a0,"second_insert");
      generator_name_00._M_str = (char *)local_7a0._M_len;
      generator_name_00._M_len = local_790._8_8_;
      parameter_01._M_str = (char *)file;
      parameter_01._M_len = (size_t)local_7a0._M_str;
      pbVar17 = (Nonnull<std::string_*>)local_7a0._M_len;
      pFVar19 = (FileDescriptor *)local_7a0._M_str;
      GetOutputFileContent_abi_cxx11_
                ((string *)local_780,(MockCodeGenerator *)local_790._0_8_,generator_name_00,
                 parameter_01,(FileDescriptor *)context,in_stack_ffffffffffffef20);
      if ((local_419 & 1) != 0) {
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&annotation_1,(char (*) [2])0x1df11df,(char (*) [3])0x1df0ea8);
        local_7b0 = (lts_20250127 *)&annotation_1;
        local_7a8 = 1;
        replacements_00._M_len = (size_type)local_780;
        replacements_00._M_array = (iterator)0x1;
        absl::lts_20250127::StrReplaceAll(local_7b0,replacements_00,pbVar17);
      }
      if (bVar3) {
        output_1._M_t.
        super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl =
             (__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
              )GeneratedCodeInfo::add_annotation
                         ((GeneratedCodeInfo *)((long)&content_1.field_2 + 8));
        GeneratedCodeInfo_Annotation::set_begin
                  ((GeneratedCodeInfo_Annotation *)
                   output_1._M_t.
                   super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                   _M_head_impl,0);
        uVar2._M_t.
        super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl =
             output_1._M_t.
             super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
             _M_head_impl;
        iVar7 = std::__cxx11::string::size();
        GeneratedCodeInfo_Annotation::set_end
                  ((GeneratedCodeInfo_Annotation *)
                   uVar2._M_t.
                   super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                   _M_head_impl,iVar7);
        uVar2 = output_1;
        puVar13 = protobuf::internal::HasBits<1>::operator[]
                            ((HasBits<1> *)
                             ((long)output_1._M_t.
                                    super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                                    ._M_head_impl + 0x10),0);
        *(byte *)puVar13 = (byte)*puVar13 | 1;
        pAVar14 = protobuf::MessageLite::GetArena
                            ((MessageLite *)
                             uVar2._M_t.
                             super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                             .
                             super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                             ._M_head_impl);
        protobuf::internal::ArenaStringPtr::Set
                  ((ArenaStringPtr *)
                   ((long)uVar2._M_t.
                          super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                          .
                          super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                          ._M_head_impl + 0x30),"second_path",pAVar14);
      }
      pvVar15 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_478,info.field_0._24_8_);
      auVar21 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar15);
      generator_name_01._M_len = auVar21._8_8_;
      generator_name_01._M_str = (char *)file;
      local_810 = auVar21;
      GetOutputFileName_abi_cxx11_(&local_800,auVar21._0_8_,generator_name_01,pFVar19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_830,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 compiler::(anonymous_namespace)::kSecondInsertionPointName,
                 (allocator<char> *)&printer_1.field_0x12f);
      iVar6 = (*context->_vptr_GeneratorContext[5])
                        (context,&local_800,local_830,(undefined1 *)((long)&content_1.field_2 + 8));
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&local_7e0,(pointer)CONCAT44(extraout_var_00,iVar6));
      std::__cxx11::string::~string(local_830);
      std::allocator<char>::~allocator((allocator<char> *)&printer_1.field_0x12f);
      std::__cxx11::string::~string((string *)&local_800);
      pZVar16 = std::
                unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                ::get(&local_7e0);
      protobuf::io::Printer::Printer((Printer *)local_968,pZVar16,'$',(AnnotationCollector *)0x0);
      sVar20 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_780);
      output_2._M_t.
      super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl =
           (__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
            )sVar20._M_len;
      protobuf::io::Printer::PrintRaw((Printer *)local_968,sVar20);
      info_1.field_0._28_1_ = protobuf::io::Printer::failed((Printer *)local_968);
      if ((bool)info_1.field_0._28_1_) {
        std::__cxx11::string::operator=
                  ((string *)test_case._M_str,"MockCodeGenerator detected write error.");
        this_local._7_1_ = 0;
      }
      info_1.field_0._29_3_ = 0;
      protobuf::io::Printer::~Printer((Printer *)local_968);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr(&local_7e0);
      std::__cxx11::string::~string((string *)local_780);
      GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)((long)&content_1.field_2 + 8));
      if (info_1.field_0._28_4_ != 0) goto LAB_012995db;
      info.field_0._24_8_ = info.field_0._24_8_ + 1;
    }
    info_1.field_0._28_4_ = 0;
LAB_012995db:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_478);
    if (info_1.field_0._28_4_ != 0) goto LAB_01299f5b;
  }
  else {
    sVar20 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)parameter);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &insert_into.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"insert=");
    bVar4 = absl::lts_20250127::StartsWith(sVar20,stack0xfffffffffffffba0);
    if (bVar4) goto LAB_01298bb7;
    auVar21 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->name_);
    generator_name_02._M_len = auVar21._8_8_;
    generator_name_02._M_str = (char *)file;
    GetOutputFileName_abi_cxx11_(&local_9a0,auVar21._0_8_,generator_name_02,(FileDescriptor *)error)
    ;
    iVar6 = (*context->_vptr_GeneratorContext[2])(context,&local_9a0);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
    ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
              ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                *)&local_980,(pointer)CONCAT44(extraout_var_01,iVar6));
    std::__cxx11::string::~string((string *)&local_9a0);
    GeneratedCodeInfo::GeneratedCodeInfo
              ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
    AnnotationProtoCollector
              ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)local_9f0,
               (GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    pZVar16 = std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              ::get(&local_980);
    if (bVar3) {
      local_10a8 = (AnnotationCollector *)local_9f0;
    }
    else {
      local_10a8 = (AnnotationCollector *)0x0;
    }
    protobuf::io::Printer::Printer((Printer *)local_b28,pZVar16,'$',local_10a8);
    auVar21 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->name_);
    generator_name_03._M_len = auVar21._8_8_;
    auVar22 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)parameter);
    pFVar19 = auVar22._8_8_;
    annotate_suffix.field_2._8_8_ = auVar22._0_8_;
    generator_name_03._M_str = (char *)annotate_suffix.field_2._8_8_;
    parameter_02._M_str = (char *)file;
    parameter_02._M_len = (size_t)pFVar19;
    GetOutputFileContent_abi_cxx11_
              (&local_b58,auVar21._0_8_,generator_name_03,parameter_02,(FileDescriptor *)context,
               in_stack_ffffffffffffef20);
    local_b38 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b58);
    protobuf::io::Printer::PrintRaw((Printer *)local_b28,local_b38);
    std::__cxx11::string::~string((string *)&local_b58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b98,"_annotation",&local_b99)
    ;
    std::allocator<char>::~allocator(&local_b99);
    if (bVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_bb0,"$p$\n");
      pAVar18 = (AlphaNum *)0x2126906;
      protobuf::io::Printer::Print<char[2],char[6]>
                ((Printer *)local_b28,local_bb0,(char (*) [2])0x2126906,(char (*) [6])0x2032272);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_bc0,"p");
      absl::lts_20250127::AlphaNum::AlphaNum(&local_c20,"first");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_c50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b98);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_bf0,(lts_20250127 *)&local_c20,&local_c50,pAVar18);
      local_bd0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_bf0);
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_c58);
      pFVar19 = (FileDescriptor *)local_bd0._M_str;
      protobuf::io::Printer::Annotate((Printer *)local_b28,local_bc0,local_bd0,local_c58);
      std::__cxx11::string::~string((string *)&local_bf0);
    }
    local_c78 = 0x3f;
    uStack_c70 = 0x1eede21;
    data_00._M_str = (char *)0x1eede21;
    data_00._M_len = 0x3f;
    protobuf::io::Printer::PrintRaw((Printer *)local_b28,data_00);
    if (bVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c88,"$p$\n");
      pAVar18 = (AlphaNum *)0x2126906;
      protobuf::io::Printer::Print<char[2],char[7]>
                ((Printer *)local_b28,local_c88,(char (*) [2])0x2126906,(char (*) [7])0x2032248);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c98,"p");
      absl::lts_20250127::AlphaNum::AlphaNum(&local_cf8,"second");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_d28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b98);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_cc8,(lts_20250127 *)&local_cf8,&local_d28,pAVar18);
      local_ca8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_cc8);
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_d30);
      pFVar19 = (FileDescriptor *)local_ca8._M_str;
      protobuf::io::Printer::Annotate((Printer *)local_b28,local_c98,local_ca8,local_d30);
      std::__cxx11::string::~string((string *)&local_cc8);
    }
    local_d48 = 0x42;
    uStack_d40 = 0x1eede61;
    data._M_str = (char *)0x1eede61;
    data._M_len = 0x42;
    protobuf::io::Printer::PrintRaw((Printer *)local_b28,data);
    if (bVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d58,"$p$\n");
      pAVar18 = (AlphaNum *)0x2126906;
      protobuf::io::Printer::Print<char[2],char[6]>
                ((Printer *)local_b28,local_d58,(char (*) [2])0x2126906,(char (*) [6])0x1dc4acc);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d68,"p");
      absl::lts_20250127::AlphaNum::AlphaNum(&local_dc8,"third");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_df8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b98);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_d98,(lts_20250127 *)&local_dc8,&local_df8,pAVar18);
      local_d78 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_d98);
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_e00);
      pFVar19 = (FileDescriptor *)local_d78._M_str;
      protobuf::io::Printer::Annotate((Printer *)local_b28,local_d68,local_d78,local_e00);
      std::__cxx11::string::~string((string *)&local_d98);
    }
    bVar4 = protobuf::io::Printer::failed((Printer *)local_b28);
    if (bVar4) {
      std::__cxx11::string::operator=
                ((string *)test_case._M_str,"MockCodeGenerator detected write error.");
      this_local._7_1_ = 0;
      bVar3 = true;
    }
    else {
      if (bVar3) {
        local_e90 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->name_)
        ;
        generator_name_04._M_len = local_e90._8_8_;
        generator_name_04._M_str = (char *)file;
        GetOutputFileName_abi_cxx11_(&local_e80,local_e90._0_8_,generator_name_04,pFVar19);
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_e60,&local_e80);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_ec0,".pb.meta");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_e30,(lts_20250127 *)&local_e60,&local_ec0,(AlphaNum *)file);
        iVar6 = (*context->_vptr_GeneratorContext[2])(context,&local_e30);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
        ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                  ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                    *)&local_e10,(pointer)CONCAT44(extraout_var_02,iVar6));
        std::__cxx11::string::~string((string *)&local_e30);
        std::__cxx11::string::~string((string *)&local_e80);
        pZVar16 = std::
                  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                  ::get(&local_e10);
        bVar3 = TextFormat::Print((Message *)&annotation_collector.annotation_proto_,pZVar16);
        if (!bVar3) {
          std::__cxx11::string::operator=
                    ((string *)test_case._M_str,"MockCodeGenerator couldn\'t write .pb.meta");
          this_local._7_1_ = 0;
        }
        bVar3 = !bVar3;
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ::~unique_ptr(&local_e10);
        if (bVar3) goto LAB_01299ecd;
      }
      bVar3 = false;
    }
LAB_01299ecd:
    std::__cxx11::string::~string((string *)local_b98);
    protobuf::io::Printer::~Printer((Printer *)local_b28);
    protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
    ~AnnotationProtoCollector
              ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)local_9f0);
    GeneratedCodeInfo::~GeneratedCodeInfo
              ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr(&local_980);
    if (bVar3) goto LAB_01299f5b;
  }
  this_local._7_1_ = 1;
LAB_01299f5b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MockCodeGenerator::Generate(const FileDescriptor* file,
                                 const std::string& parameter,
                                 GeneratorContext* context,
                                 std::string* error) const {
  // Override minimum/maximum after generating the pool to simulate a plugin
  // that "works" but doesn't advertise support of the current edition.
  absl::string_view test_case = GetTestCase();
  if (test_case == "high_minimum") {
    minimum_edition_ = Edition::EDITION_99997_TEST_ONLY;
  } else if (test_case == "low_maximum") {
    maximum_edition_ = Edition::EDITION_PROTO2;
  }

  if (GetEdition(*file) >= Edition::EDITION_2023 &&
      (suppressed_features_ & CodeGenerator::FEATURE_SUPPORTS_EDITIONS) == 0) {
    internal::VisitDescriptors(*file, [&](const auto& descriptor) {
      const FeatureSet& features = GetResolvedSourceFeatures(descriptor);
      ABSL_CHECK(features.HasExtension(pb::test))
          << "Test features were not resolved properly";
      ABSL_CHECK(features.GetExtension(pb::test).has_file_feature())
          << "Test features were not resolved properly";
      ABSL_CHECK(features.GetExtension(pb::test).has_source_feature())
          << "Test features were not resolved properly";
    });
  }

  bool annotate = false;
  for (int i = 0; i < file->message_type_count(); i++) {
    if (absl::StartsWith(file->message_type(i)->name(), "MockCodeGenerator_")) {
      absl::string_view command = absl::StripPrefix(
          file->message_type(i)->name(), "MockCodeGenerator_");
      if (command == "Error") {
        *error = "Saw message type MockCodeGenerator_Error.";
        return false;
      }
      if (command == "Exit") {
        std::cerr << "Saw message type MockCodeGenerator_Exit." << std::endl;
        exit(123);
      }
      ABSL_CHECK(command != "Abort")
          << "Saw message type MockCodeGenerator_Abort.";
      if (command == "HasSourceCodeInfo") {
        FileDescriptorProto file_descriptor_proto;
        file->CopySourceCodeInfoTo(&file_descriptor_proto);
        bool has_source_code_info =
            file_descriptor_proto.has_source_code_info() &&
            file_descriptor_proto.source_code_info().location_size() > 0;
        ABSL_LOG(FATAL)
            << "Saw message type MockCodeGenerator_HasSourceCodeInfo: "
            << has_source_code_info << ".";
      } else if (command == "HasJsonName") {
        FieldDescriptorProto field_descriptor_proto;
        file->message_type(i)->field(0)->CopyTo(&field_descriptor_proto);
        ABSL_LOG(FATAL) << "Saw json_name: "
                        << field_descriptor_proto.has_json_name();
      } else if (command == "Annotate") {
        annotate = true;
      } else if (command == "ShowVersionNumber") {
        Version compiler_version;
        context->GetCompilerVersion(&compiler_version);
        ABSL_LOG(FATAL) << "Saw compiler_version: "
                        << compiler_version.major() * 1000000 +
                               compiler_version.minor() * 1000 +
                               compiler_version.patch()
                        << " " << compiler_version.suffix();
      } else {
        ABSL_LOG(FATAL) << "Unknown MockCodeGenerator command: " << command;
      }
    }
  }

  bool insert_endlines = absl::StartsWith(parameter, "insert_endlines=");
  if (insert_endlines || absl::StartsWith(parameter, "insert=")) {
    std::vector<std::string> insert_into = absl::StrSplit(
        absl::StripPrefix(parameter,
                          insert_endlines ? "insert_endlines=" : "insert="),
        ',', absl::SkipEmpty());

    for (size_t i = 0; i < insert_into.size(); i++) {
      {
        google::protobuf::GeneratedCodeInfo info;
        std::string content =
            GetOutputFileContent(name_, "first_insert", file, context);
        if (insert_endlines) {
          absl::StrReplaceAll({{",", ",\n"}}, &content);
        }
        if (annotate) {
          auto* annotation = info.add_annotation();
          annotation->set_begin(0);
          annotation->set_end(content.size());
          annotation->set_source_file("first_path");
        }
        std::unique_ptr<io::ZeroCopyOutputStream> output(
            context->OpenForInsertWithGeneratedCodeInfo(
                GetOutputFileName(insert_into[i], file),
                std::string(kFirstInsertionPointName), info));
        io::Printer printer(output.get(), '$');
        printer.PrintRaw(content);
        if (printer.failed()) {
          *error = "MockCodeGenerator detected write error.";
          return false;
        }
      }

      {
        google::protobuf::GeneratedCodeInfo info;
        std::string content =
            GetOutputFileContent(name_, "second_insert", file, context);
        if (insert_endlines) {
          absl::StrReplaceAll({{",", ",\n"}}, &content);
        }
        if (annotate) {
          auto* annotation = info.add_annotation();
          annotation->set_begin(0);
          annotation->set_end(content.size());
          annotation->set_source_file("second_path");
        }
        std::unique_ptr<io::ZeroCopyOutputStream> output(
            context->OpenForInsertWithGeneratedCodeInfo(
                GetOutputFileName(insert_into[i], file),
                std::string(kSecondInsertionPointName), info));
        io::Printer printer(output.get(), '$');
        printer.PrintRaw(content);
        if (printer.failed()) {
          *error = "MockCodeGenerator detected write error.";
          return false;
        }
      }
    }
  } else {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        context->Open(GetOutputFileName(name_, file)));

    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    io::Printer printer(output.get(), '$',
                        annotate ? &annotation_collector : nullptr);
    printer.PrintRaw(GetOutputFileContent(name_, parameter, file, context));
    std::string annotate_suffix = "_annotation";
    if (annotate) {
      printer.Print("$p$\n", "p", "first");
      printer.Annotate("p", absl::StrCat("first", annotate_suffix));
    }
    printer.PrintRaw(kFirstInsertionPoint);
    if (annotate) {
      printer.Print("$p$\n", "p", "second");
      printer.Annotate("p", absl::StrCat("second", annotate_suffix));
    }
    printer.PrintRaw(kSecondInsertionPoint);
    if (annotate) {
      printer.Print("$p$\n", "p", "third");
      printer.Annotate("p", absl::StrCat("third", annotate_suffix));
    }

    if (printer.failed()) {
      *error = "MockCodeGenerator detected write error.";
      return false;
    }
    if (annotate) {
      std::unique_ptr<io::ZeroCopyOutputStream> meta_output(context->Open(
          absl::StrCat(GetOutputFileName(name_, file), ".pb.meta")));
      if (!TextFormat::Print(annotations, meta_output.get())) {
        *error = "MockCodeGenerator couldn't write .pb.meta";
        return false;
      }
    }
  }

  return true;
}